

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beast_Journal.cpp
# Opt level: O0

void __thiscall
beast::Journal::ScopedStream::ScopedStream(ScopedStream *this,Sink *sink,Severity level)

{
  void *this_00;
  Severity level_local;
  Sink *sink_local;
  ScopedStream *this_local;
  
  this->m_sink = sink;
  this->m_level = level;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_ostream);
  this_00 = (void *)std::ostream::operator<<(&this->m_ostream,std::boolalpha);
  std::ostream::operator<<(this_00,std::showbase);
  return;
}

Assistant:

Journal::ScopedStream::ScopedStream (Sink& sink, Severity level)
    : m_sink (sink)
    , m_level (level)
{
    // Modifiers applied from all ctors
    m_ostream
        << std::boolalpha
        << std::showbase;
}